

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O0

__sighandler_t __thiscall miniros::PollSet::signal(PollSet *this,int __sig,__sighandler_t __handler)

{
  bool bVar1;
  undefined7 extraout_var;
  __sighandler_t extraout_RAX;
  char b;
  lock_guard<std::mutex> lock;
  void *in_stack_ffffffffffffffb8;
  mutex *in_stack_ffffffffffffffc0;
  lock_guard<std::mutex> local_10;
  PollSet *local_8;
  __sighandler_t p_Var2;
  
  local_8 = this;
  bVar1 = std::mutex::try_lock(in_stack_ffffffffffffffc0);
  p_Var2 = (__sighandler_t)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard(&local_10,&this->signal_mutex_);
    write_signal((signal_fd_t *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (size_t *)0x484ae4);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x484b1c);
    p_Var2 = extraout_RAX;
  }
  return p_Var2;
}

Assistant:

void PollSet::signal()
{
  if (signal_mutex_.try_lock())
  {
    std::lock_guard<std::mutex> lock(signal_mutex_, std::adopt_lock);
    char b = 0;
    if (write_signal(signal_pipe_[1], &b, 1) < 0)
    {
      // do nothing... this prevents warnings on gcc 4.3
    }
  }
}